

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

uint64_t uv_get_constrained_memory(void)

{
  int iVar1;
  ssize_t sVar2;
  uint64_t uVar3;
  uint64_t rc;
  char buf [32];
  char filename [256];
  uint64_t local_140;
  undefined1 local_138 [32];
  char local_118 [264];
  
  snprintf(local_118,0x100,"/sys/fs/cgroup/%s/%s","memory","memory.limit_in_bytes");
  local_140 = 0;
  iVar1 = uv__open_cloexec(local_118,0);
  uVar3 = 0;
  if (-1 < iVar1) {
    sVar2 = read(iVar1,local_138,0x1f);
    if (0 < sVar2) {
      local_138[sVar2] = 0;
      __isoc99_sscanf(local_138,"%lu",&local_140);
    }
    iVar1 = uv__close_nocheckstdio(iVar1);
    uVar3 = local_140;
    if (iVar1 != 0) {
      abort();
    }
  }
  return uVar3;
}

Assistant:

static uint64_t uv__read_cgroups_uint64(const char* cgroup, const char* param) {
  char filename[256];
  uint64_t rc;
  int fd;
  ssize_t n;
  char buf[32];  /* Large enough to hold an encoded uint64_t. */

  snprintf(filename, 256, "/sys/fs/cgroup/%s/%s", cgroup, param);

  rc = 0;
  fd = uv__open_cloexec(filename, O_RDONLY);

  if (fd < 0)
    return 0;

  n = read(fd, buf, sizeof(buf) - 1);

  if (n > 0) {
    buf[n] = '\0';
    sscanf(buf, "%" PRIu64, &rc);
  }

  if (uv__close_nocheckstdio(fd))
    abort();

  return rc;
}